

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * l_alloc(void *ud,void *ptr,size_t osize,size_t nsize)

{
  size_t in_RCX;
  void *in_RSI;
  undefined8 local_8;
  
  if (in_RCX == 0) {
    free(in_RSI);
    local_8 = (void *)0x0;
  }
  else {
    local_8 = realloc(in_RSI,in_RCX);
  }
  return local_8;
}

Assistant:

static void*l_alloc(void*ud,void*ptr,size_t osize,size_t nsize){
(void)ud;
(void)osize;
if(nsize==0){
free(ptr);
return NULL;
}
else
return realloc(ptr,nsize);
}